

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

VirtualIterator<Kernel::Term_*> __thiscall
Lib::getUniquePersistentIteratorFromPtr<Kernel::NonVariableNonTypeIterator>
          (Lib *this,NonVariableNonTypeIterator *it)

{
  int *piVar1;
  int iVar2;
  UniquePersistentIterator<Kernel::NonVariableNonTypeIterator> *this_00;
  
  iVar2 = (*(it->super_IteratorCore<Kernel::Term_*>)._vptr_IteratorCore[2])(it);
  if ((char)iVar2 == '\0') {
    VirtualIterator<Kernel::Term_*>::getEmpty();
  }
  else {
    this_00 = (UniquePersistentIterator<Kernel::NonVariableNonTypeIterator> *)::operator_new(0x20);
    UniquePersistentIterator<Kernel::NonVariableNonTypeIterator>::UniquePersistentIterator
              (this_00,it);
    *(UniquePersistentIterator<Kernel::NonVariableNonTypeIterator> **)this = this_00;
    piVar1 = &(this_00->super_IteratorCore<Kernel::Term_*>)._refCnt;
    *piVar1 = *piVar1 + 1;
  }
  return (VirtualIterator<Kernel::Term_*>)(IteratorCore<Kernel::Term_*> *)this;
}

Assistant:

inline
VirtualIterator<ELEMENT_TYPE(Inner)> getUniquePersistentIteratorFromPtr(Inner* it)
{
  if(!it->hasNext()) {
    return VirtualIterator<ELEMENT_TYPE(Inner)>::getEmpty();
  }
  return vi( new UniquePersistentIterator<Inner>(*it) );
}